

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

QDate __thiscall
QtPrivate::QCalendarMonthValidator::applyToDate
          (QCalendarMonthValidator *this,undefined8 param_2,undefined8 param_3)

{
  int extraout_var;
  QDate QVar1;
  int iVar2;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  
  local_38._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_38._0_8_ = param_3;
  QCalendar::partsFromDate((QDate)local_38);
  if (extraout_var == -0x80000000) {
    QVar1.jd = -0x8000000000000000;
  }
  else {
    iVar2 = (int)(YearMonthDay *)local_38;
    QCalendar::monthsInYear(iVar2);
    QCalendar::daysInMonth(iVar2,this->m_month);
    QVar1.jd = QCalendar::dateFromParts((YearMonthDay *)local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38._8_8_) {
    return (QDate)QVar1.jd;
  }
  __stack_chk_fail();
}

Assistant:

QDate QCalendarMonthValidator::applyToDate(QDate date, QCalendar cal) const
{
    auto parts = cal.partsFromDate(date);
    if (!parts.isValid())
        return QDate();
    parts.month = qMin(qMax(1, m_month), cal.monthsInYear(parts.year));
    parts.day = qMin(parts.day, cal.daysInMonth(m_month, parts.year)); // m_month or parts.month ?
    return cal.dateFromParts(parts);
}